

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

size_ty __thiscall
gch::detail::small_vector_base<std::allocator<double>,_6U>::unchecked_calculate_new_capacity
          (small_vector_base<std::allocator<double>,_6U> *this,size_ty minimum_required_capacity)

{
  size_ty sVar1;
  size_ty sVar2;
  ulong in_RSI;
  allocator_interface<std::allocator<double>_> *in_RDI;
  size_ty new_capacity;
  size_ty current_capacity;
  size_ty local_8;
  
  sVar1 = get_capacity((small_vector_base<std::allocator<double>,_6U> *)0x19fe9d);
  sVar2 = allocator_interface<std::allocator<double>_>::get_max_size(in_RDI);
  if (sVar1 < sVar2 - sVar1) {
    local_8 = sVar1 << 1;
    if (local_8 < in_RSI) {
      local_8 = in_RSI;
    }
  }
  else {
    local_8 = allocator_interface<std::allocator<double>_>::get_max_size(in_RDI);
  }
  return local_8;
}

Assistant:

size_ty
      unchecked_calculate_new_capacity (const size_ty minimum_required_capacity) const noexcept
      {
        const size_ty current_capacity = get_capacity ();

        assert (current_capacity < minimum_required_capacity);

        if (get_max_size () - current_capacity <= current_capacity)
          return get_max_size ();

        // Note: This growth factor might be theoretically superior, but in testing it falls flat:
        // size_ty new_capacity = current_capacity + (current_capacity / 2);

        const size_ty new_capacity = 2 * current_capacity;
        if (new_capacity < minimum_required_capacity)
          return minimum_required_capacity;
        return new_capacity;
      }